

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  double **ppdVar1;
  double **ppdVar2;
  double **ppdVar3;
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  int iVar15;
  double **ppdVar16;
  double *pdVar17;
  FILE *__stream;
  double *pdVar18;
  int i;
  long lVar19;
  uint uVar20;
  int j;
  long lVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  uint uVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double in_stack_fffffffffffffe20;
  double in_stack_fffffffffffffe28;
  double in_stack_fffffffffffffe30;
  double local_118;
  double dStack_110;
  double local_68;
  double dStack_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  smoothRes = (double ***)malloc(0x20);
  lVar19 = 0;
  do {
    ppdVar16 = (double **)malloc(0x18);
    smoothRes[lVar19] = ppdVar16;
    lVar21 = 0;
    do {
      pdVar17 = (double *)malloc(0x60);
      smoothRes[lVar19][lVar21] = pdVar17;
      lVar21 = lVar21 + 1;
    } while (lVar21 != 3);
    lVar19 = lVar19 + 1;
  } while (lVar19 != 4);
  __stream = fopen(savefile,"w");
  w_InitQueue(&queueWindow_gyo,0xc);
  w_InitQueue(&queueWindow_mag,0xc);
  ppdVar16 = getDatas(0x14);
  pdVar17 = *ppdVar16;
  ax = -(*pdVar17 + 0.09092);
  ay = -(pdVar17[1] + -0.081208);
  az = -(pdVar17[2] + -0.015632);
  gx = pdVar17[3];
  gy = pdVar17[4];
  gz = pdVar17[5];
  mx = pdVar17[6];
  my = pdVar17[7];
  mz = -pdVar17[8];
  h = pdVar17[0x10];
  L = (pdVar17[0xf] * 3.1415926) / 180.0;
  E = (pdVar17[0xe] * 3.1415926) / 180.0;
  lastGPSh = h;
  last_L = L;
  last_E = E;
  Pitch0 = atan2(pdVar17[1] + -0.081208,pdVar17[2] + -0.015632);
  Roll0 = atan2(ax,-az);
  dVar11 = my;
  dVar5 = cos(Roll0);
  dVar13 = mz;
  dVar28 = sin(Roll0);
  dVar10 = mx;
  dVar29 = cos(Pitch0);
  dVar12 = my;
  dVar6 = sin(Pitch0);
  dVar7 = sin(Roll0);
  dVar14 = mz;
  dVar8 = sin(Pitch0);
  dVar27 = cos(Roll0);
  Yaw0 = atan2(dVar28 * dVar13 - dVar5 * dVar11,
               (dVar29 * dVar10 + dVar12 * dVar6 * dVar7) - dVar8 * dVar14 * dVar27);
  firstPitch = Pitch0 * 57.29578;
  firstRoll = Roll0 * 57.29578;
  firstYaw = Yaw0 * -57.29578;
  pdVar17 = EularToQuaternion(Yaw0,Pitch0,Roll0);
  q0 = *pdVar17;
  q1 = pdVar17[1];
  q2 = pdVar17[2];
  q3 = pdVar17[3];
  if (2 < count) {
    pdVar17 = ppdVar16[1];
    uVar20 = 1;
    do {
      ax = -(*pdVar17 + 0.09092);
      ay = -(pdVar17[1] + -0.081208);
      az = -(pdVar17[2] + -0.015632);
      gx = pdVar17[3];
      gy = pdVar17[4];
      gz = pdVar17[5];
      mx_Turning = pdVar17[6];
      my_Turning = pdVar17[7];
      mz_Turning = -pdVar17[8];
      GPSLongitude = pdVar17[0xe];
      GPSLattitude = pdVar17[0xf];
      GPSHeight = pdVar17[0x10];
      GPSYaw = pdVar17[0x11];
      GPSv = pdVar17[0x12];
      GPS_SN = pdVar17[0x13];
      mx = mx_Turning;
      my = my_Turning;
      mz = mz_Turning;
      slideWindows(ax,ay,az,gx,gy,gz,mx_Turning,my_Turning,in_stack_fffffffffffffe20,
                   in_stack_fffffffffffffe28,in_stack_fffffffffffffe30);
      ppdVar1 = *smoothRes;
      ppdVar2 = smoothRes[1];
      ppdVar3 = smoothRes[2];
      lVar19 = 0;
      do {
        smoothAx = smoothAx + *(double *)((long)*ppdVar1 + lVar19);
        smoothAy = smoothAy + *(double *)((long)ppdVar1[1] + lVar19);
        smoothAz = smoothAz + *(double *)((long)ppdVar1[2] + lVar19);
        smoothGx = smoothGx + *(double *)((long)*ppdVar2 + lVar19);
        smoothGy = smoothGy + *(double *)((long)ppdVar2[1] + lVar19);
        smoothGz = smoothGz + *(double *)((long)ppdVar2[2] + lVar19);
        smoothMx = smoothMx + *(double *)((long)*ppdVar3 + lVar19);
        smoothMy = smoothMy + *(double *)((long)ppdVar3[1] + lVar19);
        smoothMz = smoothMz + *(double *)((long)ppdVar3[2] + lVar19);
        smoothGPSYaw = smoothGPSYaw + *(double *)((long)*smoothRes[3] + lVar19);
        smoothGPSv = smoothGPSv + *(double *)((long)smoothRes[3][1] + lVar19);
        lVar19 = lVar19 + 8;
      } while (lVar19 != 0x60);
      smoothAx = smoothAx / 12.0;
      smoothAy = smoothAy / 12.0;
      smoothAz = smoothAz / 12.0;
      smoothGx = smoothGx / 12.0;
      smoothGy = smoothGy / 12.0;
      smoothGz = smoothGz / 12.0;
      smoothMx = smoothMx / 12.0;
      smoothMy = smoothMy / 12.0;
      smoothMz = smoothMz / 12.0;
      smoothGPSYaw = smoothGPSYaw / 12.0;
      dVar29 = smoothGPSv / 12.0;
      smoothGPSv = dVar29;
      dVar5 = cos((smoothGPSYaw * 3.1415926) / 180.0);
      dVar28 = smoothGPSv;
      GPSVn = (dVar5 * dVar29) / 3.6;
      dVar5 = sin((smoothGPSYaw * 3.1415926) / 180.0);
      GPSVe = (dVar5 * dVar28) / 3.6;
      GPSVu = GPSHeight - lastGPSh;
      MahonyAHRSupdate(gx * 0.017453292222222222,gy * 0.017453292222222222,gz * 0.017453292222222222
                       ,ax,ay,az,mx,my,mz);
      dVar5 = q0 + q0;
      dVar5 = atan2((q1 + q1) * q2 + q3 * dVar5,dVar5 * q0 + q2 * dVar5 + -1.0);
      Yaw = dVar5 * -57.295780490442965;
      dVar5 = asin((q2 + q2) * q3 + (q0 + q0) * q1);
      Pitch = dVar5 * 57.295780490442965;
      dVar5 = atan2((q1 + q1) * q3 + q2 * (q0 + q0),(q0 + q0) * q0 + (q3 + q3) * q3 + -1.0);
      Roll = dVar5 * -57.295780490442965;
      quternionToCnbMatrix(q0,q1,q2,q3);
      pdVar18 = TurnningTest(gx,gy,gz,mx_Turning,my_Turning,mz_Turning);
      magOrientation = 90.0 - pdVar18[3];
      auVar4._8_4_ = SUB84(magOrientation,0);
      auVar4._0_8_ = 90.0 - pdVar18[2];
      auVar4._12_4_ = (int)((ulong)magOrientation >> 0x20);
      *(undefined1 (*) [16])(pdVar18 + 2) = auVar4;
      dVar5 = sin((magOrientation * 3.1415926) / 180.0);
      stepP[0] = dVar5 + stepP[0];
      dVar5 = cos((pdVar18[3] * 3.1415926) / 180.0);
      stepP[1] = dVar5 + stepP[1];
      dVar5 = sin((*pdVar18 * 3.1415926) / 180.0);
      gyoP[0] = dVar5 + gyoP[0];
      dVar5 = cos((*pdVar18 * 3.1415926) / 180.0);
      gyoP[1] = dVar5 + gyoP[1];
      dVar5 = sin((pdVar18[2] * 3.1415926) / 180.0);
      magP[0] = dVar5 + magP[0];
      dVar5 = cos((pdVar18[2] * 3.1415926) / 180.0);
      magP[1] = dVar5 + magP[1];
      gyrOrienDiff = (gx + lastGz) * 0.2 * -0.5;
      if (getGyrOrientation0 == 0) {
        uVar22 = SUB84(magOrientation,0);
        uVar24 = (undefined4)((ulong)magOrientation >> 0x20);
        getGyrOrientation0 = 1;
      }
      else {
        uVar22 = SUB84(gyrOrientation,0);
        uVar24 = (undefined4)((ulong)gyrOrientation >> 0x20);
      }
      gyrOrientation = gyrOrienDiff + (double)CONCAT44(uVar24,uVar22);
      iVar15 = w_isFull(&queueWindow_gyo);
      if (iVar15 != 0) {
        w_DeQueue(&queueWindow_gyo);
      }
      iVar15 = w_isFull(&queueWindow_mag);
      if (iVar15 != 0) {
        w_DeQueue(&queueWindow_mag);
      }
      pdVar18 = pdVar18 + 3;
      w_EnQueue(&queueWindow_gyo,gyrOrientation);
      w_EnQueue(&queueWindow_mag,magOrientation);
      queueWindow_gyo_avg = w_getAVG(&queueWindow_gyo);
      queueWindow_mag_avg = w_getAVG(&queueWindow_mag);
      dVar5 = cos((Yaw * 3.1415926) / 180.0);
      Px = dVar5 + Px;
      dVar5 = sin((Yaw * 3.1415926) / 180.0);
      dVar6 = earthRe;
      Py = dVar5 + Py;
      dVar5 = earthf + earthf;
      dVar27 = earthf * 3.0;
      dVar28 = sin(last_L);
      dVar29 = sin(last_L);
      dVar8 = earthf;
      dVar7 = earthRe;
      Rm = (dVar29 * dVar28 * dVar27 + (1.0 - dVar5)) * dVar6;
      dVar5 = sin(last_L);
      dVar28 = sin(last_L);
      Rn = (dVar28 * dVar5 * dVar8 + 1.0) * dVar7;
      R0 = SQRT(Rm * Rm + Rn * Rn);
      accToFn(smoothAx,smoothAy,smoothAz);
      Fn = MatMulk(Fn,3,1,G0);
      Vccq[0] = -*Fn;
      Vccq[1] = Fn[1];
      Vccq[2] = Fn[2] + G0;
      if (doTurning == 1) {
        dVar28 = G0 * ay;
        dVar5 = sin((*pdVar18 * 3.1415926) / 180.0);
        Vccq[0] = dVar5 * dVar28;
        dVar28 = ay * G0;
        dVar5 = cos((*pdVar18 * 3.1415926) / 180.0);
        Vccq[1] = dVar5 * dVar28;
      }
      dVar28 = E;
      dVar29 = Vccq[0] * 0.2 + lastpVx;
      lastpVy = Vccq[1] * 0.2 + lastpVy;
      lastpVz = Vccq[2] * 0.2 + lastpVz;
      L = (lastpVy / (Rm + last_h)) * 0.2 + L;
      lastpVx = dVar29;
      dVar5 = cos(last_L);
      uVar23 = SUB84(Rn,0);
      uVar25 = (undefined4)((ulong)Rn >> 0x20);
      uVar22 = SUB84(lastpVz,0);
      uVar24 = (undefined4)((ulong)lastpVz >> 0x20);
      h = -lastpVz * 0.2 + h;
      E = (dVar29 / ((Rn + last_h) * dVar5)) * 0.2 + dVar28;
      lastAx = Vccq[0];
      lastAy = Vccq[1];
      lastAz = Vccq[2];
      if (4.0 <= GPS_SN) {
        firstGPSOff = 1;
        if (0x2bb0ce < (uVar20 * -0x485cd7b9 + 0x57619c >> 2 | uVar20 * -0x40000000)) {
          if (GPSout == 1) {
            E = (GPSLongitude * 3.1415926) / 180.0;
            L = (GPSLattitude * 3.1415926) / 180.0;
            h = GPSHeight;
            GPSout = 0;
            puts(
                "Now we are setting the GPS location again after GPS lost...........................................session 2_1"
                );
            uVar22 = SUB84(lastpVz,0);
            uVar24 = (undefined4)((ulong)lastpVz >> 0x20);
            uVar23 = SUB84(Rn,0);
            uVar25 = (undefined4)((ulong)Rn >> 0x20);
          }
          tao = tao + 0.2;
          local_68 = L * 57.295780490442965 - GPSLattitude;
          dStack_60 = E * 57.295780490442965 - GPSLongitude;
          local_58._8_4_ = SUB84(lastpVx - GPSVe,0);
          local_58._0_8_ = h - GPSHeight;
          local_58._12_4_ = (int)((ulong)(lastpVx - GPSVe) >> 0x20);
          dVar5 = (double)CONCAT44(uVar24,uVar22) - GPSVu;
          local_48._8_4_ = SUB84(dVar5,0);
          local_48._0_8_ = lastpVy - GPSVn;
          local_48._12_4_ = (int)((ulong)dVar5 >> 0x20);
          pdVar17 = kalman_GPS_INS_pv(&local_68,pVx,pVy,pVz,last_L,last_h,mahonyR,Fn,tao,Rm,
                                      (double)CONCAT44(uVar25,uVar23));
          lastpVx = lastpVx - pdVar17[3];
          lastpVy = lastpVy - pdVar17[4];
          lastpVz = lastpVz - pdVar17[5];
          L = pdVar17[6] * -0.29 + L;
          E = pdVar17[7] * -0.32 + E;
          h = h - pdVar17[8];
          lastGPSLongtitude = GPSLongitude;
          lastGPSLattitude = GPSLattitude;
          lastGPSh = GPSHeight;
          lastGPSyaw = smoothGPSYaw;
          lastGPSv = GPSv;
          dVar28 = ABS(L * 57.295780490442965 - GPSLattitude);
          dVar5 = ABS(E * 57.295780490442965 - GPSLongitude) * 111000.0;
          auVar9._8_4_ = SUB84(dVar5,0);
          auVar9._0_8_ = dVar28;
          auVar9._12_4_ = (int)((ulong)dVar5 >> 0x20);
          dVar5 = cos(GPSLattitude);
          dStack_110 = auVar9._8_8_;
          dVar28 = dVar28 * 111000.0;
          dVar5 = SQRT(dVar5 * dStack_110 * dVar5 * dStack_110 + dVar28 * dVar28);
          cos(GPSLattitude);
          if ((10.0 <= dVar5) && (dVar5 < 100.0)) {
            L = GPSLattitude * 0.017453292222222222;
            E = GPSLongitude * 0.017453292222222222;
          }
          if (((GPSv == 0.0) && (!NAN(GPSv))) && (ABS(0.081208 - ay) < 0.03)) {
            if (firstStaticGpsUse == 1) {
              uVar23 = SUB84(lastGPSLattitude,0);
              uVar25 = (undefined4)((ulong)lastGPSLattitude >> 0x20);
              lastGPSLattitudeStatic = lastGPSLattitude;
              uVar22 = SUB84(lastGPSLongtitude,0);
              uVar24 = (undefined4)((ulong)lastGPSLongtitude >> 0x20);
              lastGPSLongtitudeStatic = lastGPSLongtitude;
              lastGPShStatic = lastGPSh;
              firstStaticGpsUse = 0;
            }
            else {
              uVar23 = SUB84(lastGPSLattitudeStatic,0);
              uVar25 = (undefined4)((ulong)lastGPSLattitudeStatic >> 0x20);
              uVar22 = SUB84(lastGPSLongtitudeStatic,0);
              uVar24 = (undefined4)((ulong)lastGPSLongtitudeStatic >> 0x20);
            }
            L = (double)CONCAT44(uVar25,uVar23) * 0.017453292222222222;
            E = (double)CONCAT44(uVar24,uVar22) * 0.017453292222222222;
            h = lastGPShStatic;
          }
          doTurning = (int)(ABS(queueWindow_mag_avg - smoothGPSYaw) < 50.0);
          magGood = doTurning;
          goto LAB_001034b7;
        }
        lastGPSh = GPSHeight;
        h = GPSHeight;
        L = (pdVar17[0xf] * 3.1415926) / 180.0;
        E = (pdVar17[0xe] * 3.1415926) / 180.0;
        Pitch0 = atan2(-ay,-az);
        Roll0 = atan2(ax,-az);
        dVar11 = my;
        dVar5 = cos(Roll0);
        dVar13 = mz;
        dVar28 = sin(Roll0);
        dVar10 = mx;
        dVar29 = cos(Pitch0);
        dVar12 = my;
        dVar6 = sin(Pitch0);
        dVar7 = sin(Roll0);
        dVar14 = mz;
        dVar8 = sin(Pitch0);
        dVar27 = cos(Roll0);
        Yaw0 = atan2(dVar28 * dVar13 - dVar5 * dVar11,
                     (dVar29 * dVar10 + dVar12 * dVar6 * dVar7) - dVar8 * dVar14 * dVar27);
        firstPitch = Pitch0 * 57.29578;
        firstRoll = Roll0 * 57.29578;
        firstYaw = Yaw0 * -57.29578;
        pdVar17 = EularToQuaternion(Yaw0,Pitch0,Roll0);
        q0 = *pdVar17;
        q1 = pdVar17[1];
        q2 = pdVar17[2];
        q3 = pdVar17[3];
        pdVar17 = ppdVar16[(long)(int)uVar20 + 1];
        tao = 0.0;
        setNull();
      }
      else {
        if (GPS_SN < 4.0) {
          puts("lost GPS..\nNow We are in INS Mode...................................session 3");
          if (firstGPSOff == 1) {
            puts("first set lost GPS---------------------3.1");
            L_off = lastGPSLattitude * 0.017453292222222222;
            E_off = lastGPSLongtitude * 0.017453292222222222;
            h_off = lastGPSh;
            uVar23 = SUB84(queueWindow_gyo_avg,0);
            uVar25 = (undefined4)((ulong)queueWindow_gyo_avg >> 0x20);
            gyrOrientation_Off_start = queueWindow_gyo_avg;
            firstGPSOff = 0;
            uVar22 = uVar23;
            uVar24 = uVar25;
          }
          else {
            uVar22 = SUB84(queueWindow_gyo_avg,0);
            uVar24 = (undefined4)((ulong)queueWindow_gyo_avg >> 0x20);
            uVar23 = SUB84(gyrOrientation_Off_start,0);
            uVar25 = (undefined4)((ulong)gyrOrientation_Off_start >> 0x20);
          }
          dVar5 = lastGPSv;
          dVar28 = ay * G0;
          usepVy = (int)(lastGPSv < dVar28);
          if (30.0 <= ABS((double)CONCAT44(uVar24,uVar22) - (double)CONCAT44(uVar25,uVar23))) {
            if (magGood == 1) {
              GPSoffAddMod = 2;
              lastGPSyaw = *pdVar18;
              iVar15 = 2;
              uVar26 = 0x3ff00000;
            }
            else {
              GPSoffAddMod = 3;
              lastGPSyaw = Yaw;
              iVar15 = 3;
              uVar26 = 0x3fe00000;
            }
          }
          else {
            GPSoffAddMod = 1;
            iVar15 = 1;
            uVar26 = 0x3ff00000;
          }
          INS_drift_weight = (double)((ulong)uVar26 << 0x20);
          if (dVar28 <= lastGPSv) {
            if (iVar15 == 3) {
              dVar28 = sin((Yaw * 3.1415926) / 180.0);
              lastpVx = (dVar5 * dVar28) / 3.6;
              local_118 = lastGPSv;
              pdVar18 = &Yaw;
            }
            else if (iVar15 == 2) {
              dVar28 = sin((*pdVar18 * 3.1415926) / 180.0);
              lastpVx = (dVar5 * dVar28) / 3.6;
              local_118 = lastGPSv;
            }
            else {
              dVar28 = sin((lastGPSyaw * 3.1415926) / 180.0);
              lastpVx = (dVar5 * dVar28) / 3.6;
              local_118 = lastGPSv;
              pdVar18 = &lastGPSyaw;
            }
          }
          else if (iVar15 == 3) {
            dVar5 = sin((Yaw * 3.1415926) / 180.0);
            lastpVx = (dVar28 * dVar5) / 3.6;
            local_118 = ay * G0;
            pdVar18 = &Yaw;
          }
          else if (iVar15 == 2) {
            dVar5 = sin((*pdVar18 * 3.1415926) / 180.0);
            lastpVx = (dVar28 * dVar5) / 3.6;
            local_118 = ay * G0;
          }
          else {
            dVar5 = sin((lastGPSyaw * 3.1415926) / 180.0);
            lastpVx = (dVar28 * dVar5) / 3.6;
            local_118 = ay * G0;
            pdVar18 = &lastGPSyaw;
          }
          dVar5 = cos((*pdVar18 * 3.1415926) / 180.0);
          dVar28 = lastpVx;
          lastpVy = (dVar5 * local_118) / 3.6;
          L_off = (lastpVy / (Rm + last_h)) * 0.2 * INS_drift_weight + L_off;
          dVar5 = cos(last_L);
          E = (dVar28 / ((Rn + last_h) * dVar5)) * 0.2 * INS_drift_weight + E_off;
          L = L_off;
          h = h_off;
          E_off = E;
          printf("%d E = %f, L = %f, Vy = %f ,lastGPSv = %f, lastGPSyaw = %f\n",
                 SUB84(E * 57.295780490442965,0),SUB84(L_off * 57.295780490442965,0),ay * G0,
                 lastGPSv / 3.6,lastGPSyaw);
          GPSout = 1;
        }
LAB_001034b7:
        last_L = L;
        last_h = h;
        lastGz = gz;
        memset(output_string,0,1000);
        in_stack_fffffffffffffe20 = GPSVe;
        in_stack_fffffffffffffe28 = GPSVn;
        in_stack_fffffffffffffe30 = Roll;
        sprintf(output_string,
                "%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%d\n"
                ,SUB84(smoothAx,0),SUB84(smoothAy,0),smoothAz,smoothGx,smoothGy,SUB84(smoothGz,0),
                SUB84(smoothMx,0),SUB84(smoothMy,0),(ulong)uVar20);
        fputs(output_string,__stream);
        smoothAx = 0.0;
        smoothAy = 0.0;
        smoothAz = 0.0;
        smoothGx = 0.0;
        smoothGy = 0.0;
        smoothGz = 0.0;
        smoothMx = 0.0;
        smoothMy = 0.0;
        smoothMz = 0.0;
        smoothGPSYaw = 0.0;
        smoothGPSv = 0.0;
        pdVar17 = ppdVar16[(long)(int)uVar20 + 1];
      }
      uVar20 = uVar20 + 1;
    } while ((int)uVar20 <= count + -2);
  }
  fclose(__stream);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    smoothRes = (double ***) malloc(sizeof(double **) * 4);
    for (int i = 0; i < 4; i++) {
        smoothRes[i] = (double **) malloc(sizeof(double *) * 3);
        for (int j = 0; j < 3; j++)
            smoothRes[i][j] = (double *) malloc(sizeof(double) * width);
    }
    FILE *foutput = fopen(savefile, "w");
    //循环队列滑动滤波算法测试
    double value_buf[width];
    int slideN = 0;

    struct QueueWindow *qWindow_gyo = &queueWindow_gyo;
    struct QueueWindow *qWindow_mag = &queueWindow_mag;
    w_InitQueue(qWindow_gyo,qwindow_size);
    w_InitQueue(qWindow_mag,qwindow_size);

    //数据读取
    double **datas = getDatas(data_size);

    //初始化定姿
    double *data0 = (double *) malloc(sizeof(double) * data_size);
    data0 = datas[0];
    ax = -(data0[0] - accCalErr_X);
    ay = -(data0[1] - accCalErr_Y);
    az = -(data0[2] - accCalErr_Z);
    gx = data0[3];
    gy = data0[4];
    gz = data0[5];
    mx = data0[6];
    my = data0[7];
    mz = -data0[8];
    lastGPSh = data0[16];

    h = lastGPSh;
    L = data0[15]  * 3.1415926 / 180;
    E = data0[14]  * 3.1415926 / 180;
    last_E = E;
    last_L = L;
    //求初始的姿态角
    Pitch0 = atan2(-ay, -az);
    Roll0 = atan2(ax, -az);
    Yaw0 = atan2(-my * cos(Roll0) + mz * sin(Roll0),
                 mx * cos(Pitch0) + my * sin(Pitch0) * sin(Roll0) - mz * sin(Pitch0) * cos(Roll0));
    firstPitch = Pitch0 * 57.29578;
    firstRoll = Roll0 * 57.29578;
    firstYaw = -Yaw0 * 57.29578;
    //计算初始四元数
    double *m_q0 = EularToQuaternion(Yaw0, Pitch0, Roll0);
    q0 = m_q0[0];
    q1 = m_q0[1];
    q2 = m_q0[2];
    q3 = m_q0[3];
//
//    q0 = data0[20];
//    q1 = data0[21];
//    q2 = data0[22];
//    q3 = -data0[23];

    int d_count = 1;
    double *data = datas[d_count];
    int datacnt;

    while (d_count <= count - 2) {
        ax = -(data[0] - accCalErr_X);
        ay = -(data[1] - accCalErr_Y);
        az = -(data[2] - accCalErr_Z);
        gx = data[3];
        gy = data[4];
        gz = data[5];
        mx = data[6];
        my = data[7];
        mz = -data[8];
        mx_Turning = data[6];
        my_Turning = data[7];
        mz_Turning = -data[8];

        GPSLongitude = data[14];
        GPSLattitude = data[15];
        GPSHeight = data[16];
        GPSYaw = data[17];
        GPSv = data[18];
        GPS_SN = data[19];



//---------------------------------------------滑动滤波-----------------------------------------------------------------//
        //暴力法
        slideWindows(ax, ay, az, gx, gy, gz, mx, my, mz, GPSYaw, GPSv);
        for (int j = 0; j < width; ++j) {
            smoothAx += smoothRes[0][0][j];
            smoothAy += smoothRes[0][1][j];
            smoothAz += smoothRes[0][2][j];
            smoothGx += smoothRes[1][0][j];
            smoothGy += smoothRes[1][1][j];
            smoothGz += smoothRes[1][2][j];
            smoothMx += smoothRes[2][0][j];
            smoothMy += smoothRes[2][1][j];
            smoothMz += smoothRes[2][2][j];
            smoothGPSYaw += smoothRes[3][0][j];
            smoothGPSv += smoothRes[3][1][j];
        }
        smoothAx /= width;
        smoothAy /= width;
        smoothAz /= width;
        smoothGx /= width;
        smoothGy /= width;
        smoothGz /= width;
        smoothMx /= width;
        smoothMy /= width;
        smoothMz /= width;
        smoothGPSYaw /= width;
        smoothGPSv /= width;

        GPSVn = smoothGPSv * cos(smoothGPSYaw * 3.1415926 / 180) / 3.6;
        GPSVe = smoothGPSv * sin(smoothGPSYaw * 3.1415926 / 180) / 3.6;
        GPSVu = GPSHeight - lastGPSh;

//-----------------------------------------------滑动滤波结束-------------------------------------------------------------------//

//-------------------------------------------------以下是乱七八糟的测试部分------------------------------------------------//
//        //用mahony互补滤波更新四元数并计算出姿态角
        MahonyAHRSupdate((gx * deg_rad), (gy * deg_rad), (gz * deg_rad), ax,
                         ay, az, mx, my, mz);
        Yaw = -atan2(2 * q1 * q2 + 2 * q0 * q3, 2 * q0 * q0 + 2 * q0 * q2 - 1) * rad_deg;
        Pitch = asin(2 * q2 * q3 + 2 * q0 * q1) * rad_deg;
        Roll = -atan2(2 * q1 * q3 + 2 * q0 * q2, 2 * q0 * q0 + 2 * q3 * q3 - 1) * rad_deg;

        //有更新四元数得到更新旋转矩阵Cnb
//        q0 = data[20];
//        q1 = data[21];
//        q2 = data[22];
//        q3 = -data[23];

        quternionToCnbMatrix(q0, q1, q2, q3);


        double *resultOrientation = TurnningTest(gx, gy, gz, mx_Turning, my_Turning, mz_Turning);
        //调整磁力方向定义域
        resultOrientation[2] = 90 - resultOrientation[2];
        resultOrientation[3] = 90 - resultOrientation[3];
        magOrientation = resultOrientation[3];
        stepP[0] += sin(resultOrientation[3] * 3.1415926 / 180);
        stepP[1] += cos(resultOrientation[3] * 3.1415926 / 180);
        gyoP[0] += sin(resultOrientation[0] * 3.1415926 / 180);
        gyoP[1] += cos(resultOrientation[0] * 3.1415926 / 180);
        magP[0] += sin(resultOrientation[2] * 3.1415926 / 180);
        magP[1] += cos(resultOrientation[2] * 3.1415926 / 180);
        
        //计算间隔内的陀螺仪绕z轴的方向增量
        gyrOrienDiff = (gx + lastGz) * samplePeriod * 0.5;
        gyrOrienDiff = -gyrOrienDiff;
        //获得初始的陀螺仪方向
        if(getGyrOrientation0 == 0){
            gyrOrientation = magOrientation;
            getGyrOrientation0 = 1;
            gyrOrientation += gyrOrienDiff;
        }else{
            gyrOrientation += gyrOrienDiff;
        }
        if(w_isFull(qWindow_gyo))
            w_DeQueue(qWindow_gyo);
        if(w_isFull(qWindow_mag))
            w_DeQueue(qWindow_mag);
        w_EnQueue(qWindow_gyo,gyrOrientation);
        w_EnQueue(qWindow_mag,magOrientation);

        queueWindow_gyo_avg = w_getAVG(qWindow_gyo);
        queueWindow_mag_avg = w_getAVG(qWindow_mag);

        //测试单步长匀速路径
        Px += cos(Yaw * 3.1415926 / 180);
        Py += sin(Yaw * 3.1415926 / 180);


        //转置得到Cbn

        //计算更新的子午曲率半径Rm和卯酉曲率半径Rn以及曲率平均半径R0
        Rm = earthRe * (1 - 2 * earthf + 3 * earthf * sin(last_L) * sin(last_L));
        Rn = earthRe * (1 + earthf * sin(last_L) * sin(last_L));
        R0 = sqrt(Rm * Rm + Rn * Rn);

//-----------------------------------------------------积分测试部分--------------------------------------------------------//
        //投影到东北天坐标系下计算绝对加速度比力和计算绝对速度微分Vccq
        accToFn(smoothAx, smoothAy, smoothAz);
        Fn = MatMulk(Fn, 3, 1, G0);

//        Fn[0] = data[40];
//        Fn[1] = data[41];
//        Fn[2] = data[42];

        Vccq[0] = -Fn[0];
        Vccq[1] = Fn[1];
        Vccq[2] = Fn[2] + G0;
        if(doTurning == 1){
            Vccq[0] = ay * G0 * sin(resultOrientation[3] * 3.1415926 / 180);
            Vccq[1] = ay * G0 * cos(resultOrientation[3] * 3.1415926 / 180);
        }


        lastpVx += (Vccq[0]) * samplePeriod;
        lastpVy += (Vccq[1]) * samplePeriod;
        lastpVz += (Vccq[2]) * samplePeriod;

        L = L + (lastpVy / (Rm + last_h)) * samplePeriod;
        E = E + (lastpVx / (cos(last_L) * (Rn + last_h))) * samplePeriod;
        h = h - lastpVz * samplePeriod;

        lastAx = Vccq[0];
        lastAy = Vccq[1];
        lastAz = Vccq[2];



//
////---------------------------------------------------------融合------------------------------
        if (GPS_SN >= 4) {
            firstGPSOff = 1;
            if(d_count % worksize == 0 ){
                lastGPSh = GPSHeight;
                h = lastGPSh;
                L = data[15]  * 3.1415926 / 180;
                E = data[14]  * 3.1415926 / 180;
                //求初始的姿态角
                Pitch0 = atan2(-ay, -az);
                Roll0 = atan2(ax, -az);
                Yaw0 = atan2(-my * cos(Roll0) + mz * sin(Roll0),
                             mx * cos(Pitch0) + my * sin(Pitch0) * sin(Roll0) - mz * sin(Pitch0) * cos(Roll0));
                firstPitch = Pitch0 * 57.29578;
                firstRoll = Roll0 * 57.29578;
                firstYaw = -Yaw0 * 57.29578;
                //计算初始四元数
                double *m_q0 = EularToQuaternion(Yaw0, Pitch0, Roll0);
                q0 = m_q0[0];
                q1 = m_q0[1];
                q2 = m_q0[2];
                q3 = m_q0[3];
                d_count++;
                data = datas[d_count];
                tao = 0;
                setNull();
                continue;
            }

            //printf("Now we are in the GPS/INS mode...........................................session 2\n");
            if(GPSout == 1){
                E = GPSLongitude * 3.1415926 / 180;
                L = GPSLattitude * 3.1415926 / 180;
                h = GPSHeight;
                GPSout = 0;
                printf("Now we are setting the GPS location again after GPS lost...........................................session 2_1\n");
            }

//---------------------------------------------------------融合------------------------------
            tao += samplePeriod;
            double Dpv[6] = {L * rad_deg - GPSLattitude, E * rad_deg - GPSLongitude, h - GPSHeight, lastpVx - GPSVe,
                             lastpVy - GPSVn, lastpVz - GPSVu};

//            char datas_tokf[10000];
//            sprintf(datas_tokf,"%d,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f\n"
//                    ,datacnt,Dpv[0],Dpv[1],Dpv[2]
//                    ,Dpv[3],Dpv[4],Dpv[5]
//                    ,pVx,pVy,pVz
//                    ,last_L,last_h,Fn[0]
//                    ,Fn[1],Fn[2]
//                    ,tao,Rm,Rn
//                    ,mahonyR[0],mahonyR[1],mahonyR[2]
//                    ,mahonyR[3],mahonyR[4],mahonyR[5]
//                    ,mahonyR[6],mahonyR[7],mahonyR[8]);
//            fprintf(f_tokf,datas_tokf,10000);

            double *XX = kalman_GPS_INS_pv(Dpv, pVx, pVy, pVz, last_L, last_h, mahonyR, Fn, tao, Rm, Rn);

//            char datas_kfresult[10000];
//            sprintf(datas_kfresult,"%d,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f\n"
//                    ,datacnt,XX[0],XX[1],XX[2],XX[3],XX[4],XX[5],XX[6],XX[7],XX[8],XX[9]
//                    ,XX[10],XX[11],XX[12],XX[13],XX[15]);
//            fprintf(f_kfresult,datas_kfresult,10000);

            lastpVx -= XX[3];
            lastpVy -= XX[4];
            lastpVz -= XX[5];
            L -= 0.29 * XX[6];
            E -= 0.32 * XX[7];
            h -= XX[8];


            lastGPSLongtitude = GPSLongitude;
            lastGPSLattitude = GPSLattitude;
            lastGPSh = GPSHeight;
            lastGPSyaw = smoothGPSYaw;
            lastGPSv = GPSv;

            double L_distance = fabs(L * rad_deg - GPSLattitude) * 111000;
            double E_distance = fabs(E * rad_deg - GPSLongitude) * 111000 * cos(GPSLattitude);
            double distance1 = sqrt(pow(L_distance,2) + pow(E_distance,2));
            double L_distance2 = fabs(lastGPSLattitude - GPSLattitude) * 111000;
            double E_distance2 = fabs(lastGPSLongtitude - GPSLongitude) * 111000 * cos(GPSLattitude);
            double distance2 = sqrt(pow(L_distance,2) + pow(E_distance,2));

            if(distance1 >= distace_GPS && distance2 < 100){
                L = GPSLattitude * deg_rad;
                E = GPSLongitude * deg_rad;
            }

            if (GPSv == 0 && fabs(-ay + accCalErr_Y) < 0.03){
                if(firstStaticGpsUse == 1)
                {
                    lastGPSLattitudeStatic = lastGPSLattitude;
                    lastGPSLongtitudeStatic = lastGPSLongtitude;
                    lastGPShStatic = lastGPSh;
                    firstStaticGpsUse = 0;
                }
                L = lastGPSLattitudeStatic * deg_rad;
                E = lastGPSLongtitudeStatic * deg_rad;
                h = lastGPShStatic;

            }

            //根据磁力航向和gps航向比较判断当前磁力是否有效
            if (fabs(queueWindow_mag_avg - smoothGPSYaw) < 50) {
                magGood = 1;//Turning模式
                doTurning = 1;
            }
            else{
                magGood = 0;//Mahony模式
                doTurning = 0;
            }

        }else if(GPS_SN < 4){
            printf("lost GPS..\nNow We are in INS Mode...................................session 3\n");
            if (firstGPSOff == 1){
                printf("first set lost GPS---------------------3.1\n");
                L_off = lastGPSLattitude * deg_rad;
                E_off = lastGPSLongtitude * deg_rad;
                h_off = lastGPSh;
                //设置刚进入失效阶段的陀螺仪角度
                gyrOrientation_Off_start = queueWindow_gyo_avg;
                firstGPSOff = 0;
            }

            //进行失效速度选择
            if (ay * G0 > lastGPSv) {
                usepVy = 1;
                INS_drift_weight = 0.5;
            }
            else {
                usepVy = 0;
                INS_drift_weight = 1;
            }
            //进行失效模式判断
            if (fabs(queueWindow_gyo_avg - gyrOrientation_Off_start) < 30) {
                GPSoffAddMod = 1;
                INS_drift_weight = 1;
            }
            else if(magGood == 1) {
                GPSoffAddMod = 2;
                lastGPSyaw = resultOrientation[3];
                INS_drift_weight = 1;
            }
            else {
                GPSoffAddMod = 3;
                lastGPSyaw = Yaw;
                INS_drift_weight = 0.5;
            }


            if (usepVy == 0){
                if (GPSoffAddMod == 1) {
                    lastpVx = lastGPSv * sin(lastGPSyaw * 3.1415926 / 180) / 3.6;
                    lastpVy = lastGPSv * cos(lastGPSyaw * 3.1415926 / 180) / 3.6;
                }else if (GPSoffAddMod == 2){
                    lastpVx = lastGPSv * sin(resultOrientation[3] * 3.1415926 / 180) / 3.6;
                    lastpVy = lastGPSv * cos(resultOrientation[3] * 3.1415926 / 180) / 3.6;
                } else if(GPSoffAddMod == 3){
                    lastpVx = lastGPSv * sin(Yaw * 3.1415926 / 180) / 3.6;
                    lastpVy = lastGPSv * cos(Yaw * 3.1415926 / 180) / 3.6;
                }
            }
            else {
                if (GPSoffAddMod == 1) {
                    lastpVx = ay * G0 * sin(lastGPSyaw * 3.1415926 / 180) / 3.6;
                    lastpVy = ay * G0 * cos(lastGPSyaw * 3.1415926 / 180) / 3.6;
                }else if (GPSoffAddMod == 2){
                    lastpVx = ay * G0 * sin(resultOrientation[3] * 3.1415926 / 180) / 3.6;
                    lastpVy = ay * G0 * cos(resultOrientation[3] * 3.1415926 / 180) / 3.6;
                } else if(GPSoffAddMod == 3){
                    lastpVx = ay * G0 * sin(Yaw * 3.1415926 / 180) / 3.6;
                    lastpVy = ay * G0 * cos(Yaw * 3.1415926 / 180) / 3.6;
                }
            }
            L_off += (lastpVy / (Rm + last_h)) * samplePeriod * INS_drift_weight;
            E_off += (lastpVx / (cos(last_L) * (Rn + last_h))) * samplePeriod * INS_drift_weight;
            L = L_off;
            E = E_off;
            h = h_off;
            printf("%d E = %f, L = %f, Vy = %f ,lastGPSv = %f, lastGPSyaw = %f\n",d_count,E * rad_deg,L * rad_deg,ay * G0,lastGPSv/ 3.6,lastGPSyaw);
            GPSout = 1;

        }
        last_L = L;
        last_h = h;
        lastGz = gz;

        memset(output_string, 0, 1000);
        sprintf(output_string, "%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,"
                        "%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%f,%d\n",
                smoothAx, smoothAy, smoothAz, smoothGx, smoothGy, smoothGz, smoothMx, smoothMy, smoothMz, smoothGPSYaw,
                smoothGPSv, GPSVe, GPSVn, Roll, Pitch, Yaw, Vccq[0], Vccq[1], Vccq[2], pVx, pVy, pVz, E * rad_deg,
                L * rad_deg, h,resultOrientation[0],resultOrientation[1],resultOrientation[2],resultOrientation[3],
                stepP[0],stepP[1],lastGPSLattitude,lastGPSyaw,queueWindow_mag_avg,queueWindow_gyo_avg,d_count);

        fprintf(foutput, "%s", output_string);

        smoothAx = 0;
        smoothAy = 0;
        smoothAz = 0;
        smoothGx = 0;
        smoothGy = 0;
        smoothGz = 0;
        smoothMx = 0;
        smoothMy = 0;
        smoothMz = 0;
        smoothGPSYaw = 0;
        smoothGPSv = 0;
        d_count++;
        data = datas[d_count];
    }
    fclose(foutput);
}